

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_posix.cpp
# Opt level: O2

int __thiscall pstore::file::file_handle::close(file_handle *this,int __fd)

{
  int extraout_EAX;
  int *piVar1;
  char *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  error_code eVar2;
  error_code err;
  error_or<int> file_or_error;
  error_or<int> local_50;
  string local_38 [32];
  
  this->is_writable_ = false;
  close_noex(&local_50,this->file_);
  if (local_50.has_error_ != true) {
    piVar1 = error_or<int>::value_storage_impl<pstore::error_or<int>&,int>(&local_50);
    this->file_ = *piVar1;
    error_or<int>::~error_or(&local_50);
    return extraout_EAX;
  }
  eVar2 = error_or<int>::get_error(&local_50);
  std::__cxx11::string::string(local_38,(string *)&this->path_);
  err._M_cat = (error_category *)local_38;
  err._0_8_ = eVar2._M_cat;
  (anonymous_namespace)::raise_file_error<std::error_code,char_const*,std::__cxx11::string>
            ((_anonymous_namespace_ *)(ulong)(uint)eVar2._M_value,err,in_RCX,in_R8);
}

Assistant:

void file_handle::close () {
            is_writable_ = false;
            auto file_or_error = file_handle::close_noex (file_);
            if (!file_or_error) {
                raise_file_error (file_or_error.get_error (), "Unable to close", path_);
            }
            file_ = *file_or_error;
        }